

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__do_zlib(stbi__zbuf *a,char *obuf,int olen,int exp,int parse_header)

{
  stbi__zhuffman *z;
  uint uVar1;
  byte *pbVar2;
  stbi_uc *psVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  ushort uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  stbi_uc *psVar13;
  stbi_uc sVar14;
  byte *pbVar15;
  byte *pbVar16;
  ulong uVar17;
  long lVar18;
  char *pcVar19;
  long lVar20;
  stbi__uint32 sVar21;
  stbi__uint32 sVar22;
  uint uVar23;
  int iVar24;
  ulong uVar25;
  long in_FS_OFFSET;
  stbi_uc lencodes [455];
  stbi__zhuffman z_codelength;
  undefined8 local_a08;
  undefined7 uStack_a00;
  undefined4 uStack_9f9;
  byte bStack_9e9;
  stbi_uc local_9e8 [468];
  stbi__zhuffman local_814;
  
  a->zout_start = obuf;
  a->zout = obuf;
  a->zout_end = obuf + olen;
  a->z_expandable = exp;
  if (parse_header == 0) {
LAB_0010a757:
    a->num_bits = 0;
    a->code_buffer = 0;
    z = &a->z_distance;
    iVar12 = 0;
LAB_0010a784:
    pcVar19 = "zlib corrupt";
    if (iVar12 < 1) {
      stbi__fill_bits(a);
      iVar12 = a->num_bits;
    }
    uVar1 = a->code_buffer;
    sVar21 = uVar1 >> 1;
    a->code_buffer = sVar21;
    iVar6 = iVar12 + -1;
    a->num_bits = iVar6;
    if (iVar12 < 3) {
      stbi__fill_bits(a);
      iVar6 = a->num_bits;
      sVar21 = a->code_buffer;
    }
    sVar22 = sVar21 >> 2;
    a->code_buffer = sVar22;
    uVar5 = iVar6 - 2;
    a->num_bits = uVar5;
    switch(sVar21 & 3) {
    case 0:
      uVar10 = uVar5 & 7;
      if (uVar10 != 0) {
        if (iVar6 < 2) {
          stbi__fill_bits(a);
          uVar5 = a->num_bits;
          sVar22 = a->code_buffer;
        }
        sVar22 = sVar22 >> (sbyte)uVar10;
        a->code_buffer = sVar22;
        uVar5 = uVar5 - uVar10;
        a->num_bits = uVar5;
      }
      if ((int)uVar5 < 1) {
        if ((int)uVar5 < 0) goto LAB_0010b095;
        uVar25 = 0;
LAB_0010af8c:
        psVar13 = a->zbuffer;
        psVar3 = a->zbuffer_end;
        do {
          if (psVar13 < psVar3) {
            a->zbuffer = psVar13 + 1;
            sVar14 = *psVar13;
            psVar13 = psVar13 + 1;
          }
          else {
            sVar14 = '\0';
          }
          *(stbi_uc *)((long)local_814.fast + uVar25) = sVar14;
          uVar25 = uVar25 + 1;
        } while (uVar25 != 4);
      }
      else {
        uVar10 = uVar5 - 1 >> 3;
        uVar25 = (ulong)(uVar10 + 1);
        uVar17 = 0xffffffffffffffff;
        do {
          *(char *)((long)local_814.fast + uVar17 + 1) = (char)sVar22;
          sVar22 = sVar22 >> 8;
          uVar17 = uVar17 + 1;
        } while (uVar10 != uVar17);
        iVar12 = uVar5 - (uVar5 - 1 & 0xfffffff8);
        a->code_buffer = sVar22;
        a->num_bits = iVar12 + -8;
        if (iVar12 != 8) goto LAB_0010b095;
        if (uVar17 < 3) goto LAB_0010af8c;
      }
      if ((local_814.fast[1] ^ local_814.fast[0]) != 0xffff) {
LAB_0010b095:
        *(char **)(in_FS_OFFSET + -0x20) = pcVar19;
        return 0;
      }
      psVar13 = a->zbuffer;
      uVar25 = (ulong)local_814.fast[0];
      if (a->zbuffer_end < psVar13 + uVar25) {
        pcVar19 = "read past buffer";
        goto LAB_0010b095;
      }
      pcVar19 = a->zout;
      if (a->zout_end < pcVar19 + uVar25) {
        iVar12 = stbi__zexpand(a,pcVar19,(uint)local_814.fast[0]);
        if (iVar12 == 0) {
          return 0;
        }
        psVar13 = a->zbuffer;
        pcVar19 = a->zout;
      }
      memcpy(pcVar19,psVar13,uVar25);
      a->zbuffer = a->zbuffer + uVar25;
      a->zout = a->zout + uVar25;
      goto LAB_0010b021;
    case 1:
      iVar12 = stbi__zbuild_huffman
                         (&a->z_length,
                          "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\b\b\b\b\b\b\b\b"
                          ,0x120);
      if (iVar12 == 0) {
        return 0;
      }
      iVar12 = stbi__zbuild_huffman
                         (z,
                          "\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05"
                          ,0x20);
      break;
    case 2:
      if (iVar6 < 7) {
        stbi__fill_bits(a);
        uVar5 = a->num_bits;
        sVar22 = a->code_buffer;
      }
      sVar21 = sVar22 >> 5;
      a->code_buffer = sVar21;
      iVar12 = uVar5 - 5;
      a->num_bits = iVar12;
      if ((int)uVar5 < 10) {
        stbi__fill_bits(a);
        iVar12 = a->num_bits;
        sVar21 = a->code_buffer;
      }
      uVar5 = sVar21 >> 5;
      a->code_buffer = uVar5;
      iVar6 = iVar12 + -5;
      a->num_bits = iVar6;
      if (iVar12 < 9) {
        stbi__fill_bits(a);
        iVar6 = a->num_bits;
        uVar5 = a->code_buffer;
      }
      uVar23 = (sVar22 & 0x1f) + 0x101;
      iVar12 = (sVar21 & 0x1f) + 1;
      uVar10 = uVar5 >> 4;
      a->code_buffer = uVar10;
      iVar6 = iVar6 + -4;
      a->num_bits = iVar6;
      local_a08 = 0;
      uStack_a00 = 0;
      uStack_9f9 = 0;
      uVar25 = 0;
      do {
        uVar11 = uVar10;
        if (iVar6 < 3) {
          stbi__fill_bits(a);
          iVar6 = a->num_bits;
          uVar11 = a->code_buffer;
        }
        uVar10 = uVar11 >> 3;
        a->code_buffer = uVar10;
        iVar6 = iVar6 + -3;
        a->num_bits = iVar6;
        *(byte *)((long)&local_a08 +
                 (ulong)(byte)(&stbi__compute_huffman_codes(stbi__zbuf*)::length_dezigzag)[uVar25])
             = (byte)uVar11 & 7;
        uVar25 = uVar25 + 1;
      } while ((uVar5 & 0xf) + 4 != uVar25);
      iVar6 = stbi__zbuild_huffman(&local_814,(stbi_uc *)&local_a08,0x13);
      if (iVar6 == 0) {
        return 0;
      }
      iVar7 = iVar12 + uVar23;
      iVar6 = a->num_bits;
      iVar24 = 0;
      do {
        if (iVar6 < 0x10) {
          if (a->zbuffer_end <= a->zbuffer) goto LAB_0010b03f;
          stbi__fill_bits(a);
        }
        uVar5 = a->code_buffer;
        uVar9 = local_814.fast[uVar5 & 0x1ff];
        if (uVar9 == 0) {
          uVar9 = (ushort)uVar5 << 8 | (ushort)uVar5 >> 8;
          uVar10 = (uVar9 & 0xf0f) << 4 | (uVar9 & 0xf0f0) >> 4;
          uVar10 = (uVar10 >> 2 & 0x3333) + (uVar10 & 0x3333) * 4;
          uVar10 = (uVar10 >> 1 & 0x5555) + (uVar10 & 0x5555) * 2;
          lVar8 = 0;
          do {
            lVar18 = lVar8;
            lVar8 = lVar18 + 1;
          } while (local_814.maxcode[lVar18 + 10] <= (int)uVar10);
          if (((0xf < lVar18 + 10U) ||
              (lVar20 = (ulong)local_814.firstsymbol[lVar18 + 10] +
                        ((ulong)(uVar10 >> (7U - (char)lVar8 & 0x1f)) -
                        (ulong)local_814.firstcode[lVar18 + 10]), 0x11f < (int)lVar20)) ||
             ((ulong)*(byte *)((long)&local_814 + lVar20 + 0x484) - 9 != lVar8)) goto LAB_0010b03f;
          uVar5 = uVar5 >> ((byte)(lVar18 + 10U) & 0x1f);
          a->code_buffer = uVar5;
          iVar6 = (a->num_bits - (int)lVar8) + -9;
          a->num_bits = iVar6;
          uVar9 = *(ushort *)((long)&local_814 + lVar20 * 2 + 0x5a4);
        }
        else {
          uVar5 = uVar5 >> ((byte)(uVar9 >> 9) & 0x1f);
          a->code_buffer = uVar5;
          iVar6 = a->num_bits - (uint)(uVar9 >> 9);
          a->num_bits = iVar6;
          uVar9 = uVar9 & 0x1ff;
        }
        if (0x12 < uVar9) goto LAB_0010b03f;
        if (uVar9 < 0x10) {
          local_9e8[iVar24] = (char)uVar9;
          iVar24 = iVar24 + 1;
        }
        else {
          if (uVar9 == 0x11) {
            if (iVar6 < 3) {
              stbi__fill_bits(a);
              iVar6 = a->num_bits;
              uVar5 = a->code_buffer;
            }
            a->code_buffer = uVar5 >> 3;
            iVar6 = iVar6 + -3;
            a->num_bits = iVar6;
            uVar5 = (uVar5 & 7) + 3;
LAB_0010aefc:
            bVar4 = 0;
          }
          else {
            if (uVar9 != 0x10) {
              if (iVar6 < 7) {
                stbi__fill_bits(a);
                iVar6 = a->num_bits;
                uVar5 = a->code_buffer;
              }
              a->code_buffer = uVar5 >> 7;
              iVar6 = iVar6 + -7;
              a->num_bits = iVar6;
              uVar5 = (uVar5 & 0x7f) + 0xb;
              goto LAB_0010aefc;
            }
            if (iVar6 < 2) {
              stbi__fill_bits(a);
              iVar6 = a->num_bits;
              uVar5 = a->code_buffer;
            }
            a->code_buffer = uVar5 >> 2;
            iVar6 = iVar6 + -2;
            a->num_bits = iVar6;
            if (iVar24 == 0) goto LAB_0010b03f;
            uVar5 = (uVar5 & 3) + 3;
            bVar4 = (&bStack_9e9)[iVar24];
          }
          if (iVar7 - iVar24 < (int)uVar5) goto LAB_0010b03f;
          memset(local_9e8 + iVar24,(uint)bVar4,(ulong)uVar5);
          iVar24 = iVar24 + uVar5;
        }
      } while (iVar24 < iVar7);
      if (iVar24 != iVar7) {
LAB_0010b03f:
        pcVar19 = "bad codelengths";
LAB_0010b046:
        *(char **)(in_FS_OFFSET + -0x20) = pcVar19;
        return 0;
      }
      iVar6 = stbi__zbuild_huffman(&a->z_length,local_9e8,uVar23);
      if (iVar6 == 0) {
        return 0;
      }
      iVar12 = stbi__zbuild_huffman(z,local_9e8 + uVar23,iVar12);
      break;
    case 3:
      goto LAB_0010b06c;
    }
    if (iVar12 == 0) {
      return 0;
    }
    pcVar19 = a->zout;
LAB_0010a8a4:
    if (a->num_bits < 0x10) {
      if (a->zbuffer < a->zbuffer_end) {
        stbi__fill_bits(a);
        goto LAB_0010a8bf;
      }
    }
    else {
LAB_0010a8bf:
      uVar5 = a->code_buffer;
      uVar9 = (a->z_length).fast[uVar5 & 0x1ff];
      if (uVar9 == 0) {
        uVar9 = (ushort)uVar5 << 8 | (ushort)uVar5 >> 8;
        uVar10 = (uVar9 & 0xf0f) << 4 | (uVar9 & 0xf0f0) >> 4;
        uVar10 = (uVar10 >> 2 & 0x3333) + (uVar10 & 0x3333) * 4;
        uVar10 = (uVar10 >> 1 & 0x5555) + (uVar10 & 0x5555) * 2;
        lVar8 = 0;
        do {
          lVar18 = lVar8;
          lVar8 = lVar18 + 1;
        } while ((a->z_length).maxcode[lVar18 + 10] <= (int)uVar10);
        if (((0xf < lVar18 + 10U) ||
            (lVar20 = (ulong)(a->z_length).firstsymbol[lVar18 + 10] +
                      ((ulong)(uVar10 >> (7U - (char)lVar8 & 0x1f)) -
                      (ulong)(a->z_length).firstcode[lVar18 + 10]), 0x11f < (int)lVar20)) ||
           ((ulong)*(byte *)((long)a + lVar20 + 0x4b8) - 9 != lVar8)) goto LAB_0010b036;
        uVar5 = uVar5 >> ((byte)(lVar18 + 10U) & 0x1f);
        a->code_buffer = uVar5;
        iVar12 = (a->num_bits - (int)lVar8) + -9;
        a->num_bits = iVar12;
        uVar10 = (uint)*(ushort *)((long)a + lVar20 * 2 + 0x5d8);
      }
      else {
        uVar5 = uVar5 >> ((byte)(uVar9 >> 9) & 0x1f);
        a->code_buffer = uVar5;
        iVar12 = a->num_bits - (uint)(uVar9 >> 9);
        a->num_bits = iVar12;
        uVar10 = uVar9 & 0x1ff;
      }
      if (uVar10 < 0x100) {
        if (a->zout_end <= pcVar19) {
          iVar12 = stbi__zexpand(a,pcVar19,1);
          if (iVar12 == 0) {
            return 0;
          }
          pcVar19 = a->zout;
        }
        *pcVar19 = (char)uVar10;
        pcVar19 = pcVar19 + 1;
        goto LAB_0010a8a4;
      }
      if (uVar10 == 0x100) goto LAB_0010b030;
      if (uVar10 < 0x11e) {
        uVar25 = (ulong)(uVar10 - 0x101);
        uVar10 = stbi__zlength_base[uVar25];
        if (0xffffffffffffffeb < uVar25 - 0x1c) {
          iVar6 = stbi__zlength_extra[uVar25];
          if (iVar12 < iVar6) {
            stbi__fill_bits(a);
            iVar12 = a->num_bits;
            uVar5 = a->code_buffer;
          }
          uVar23 = ~(-1 << ((byte)iVar6 & 0x1f)) & uVar5;
          uVar5 = uVar5 >> ((byte)iVar6 & 0x1f);
          a->code_buffer = uVar5;
          iVar12 = iVar12 - iVar6;
          a->num_bits = iVar12;
          uVar10 = uVar10 + uVar23;
        }
        if (iVar12 < 0x10) {
          if (a->zbuffer_end <= a->zbuffer) goto LAB_0010b036;
          stbi__fill_bits(a);
          uVar5 = a->code_buffer;
        }
        uVar9 = z->fast[uVar5 & 0x1ff];
        if (uVar9 == 0) {
          uVar9 = (ushort)uVar5 << 8 | (ushort)uVar5 >> 8;
          uVar23 = (uVar9 & 0xf0f) << 4 | (uVar9 & 0xf0f0) >> 4;
          uVar23 = (uVar23 >> 2 & 0x3333) + (uVar23 & 0x3333) * 4;
          uVar23 = (uVar23 >> 1 & 0x5555) + (uVar23 & 0x5555) * 2;
          lVar8 = 0;
          do {
            lVar18 = lVar8;
            lVar8 = lVar18 + 1;
          } while ((a->z_distance).maxcode[lVar18 + 10] <= (int)uVar23);
          if (((0xf < lVar18 + 10U) ||
              (lVar20 = (ulong)(a->z_distance).firstsymbol[lVar18 + 10] +
                        ((ulong)(uVar23 >> (7U - (char)lVar8 & 0x1f)) -
                        (ulong)(a->z_distance).firstcode[lVar18 + 10]), 0x11f < (int)lVar20)) ||
             ((ulong)*(byte *)((long)a + lVar20 + 0xc9c) - 9 != lVar8)) goto LAB_0010b036;
          uVar5 = uVar5 >> ((byte)(lVar18 + 10U) & 0x1f);
          a->code_buffer = uVar5;
          iVar12 = (a->num_bits - (int)lVar8) + -9;
          a->num_bits = iVar12;
          uVar23 = (uint)*(ushort *)((long)a + lVar20 * 2 + 0xdbc);
        }
        else {
          uVar5 = uVar5 >> ((byte)(uVar9 >> 9) & 0x1f);
          a->code_buffer = uVar5;
          iVar12 = a->num_bits - (uint)(uVar9 >> 9);
          a->num_bits = iVar12;
          uVar23 = uVar9 & 0x1ff;
        }
        if (0x1d < uVar23) goto LAB_0010b036;
        iVar6 = stbi__zdist_base[uVar23];
        if (3 < uVar23) {
          iVar24 = stbi__zdist_extra[uVar23];
          if (iVar12 < iVar24) {
            stbi__fill_bits(a);
            iVar12 = a->num_bits;
            uVar5 = a->code_buffer;
          }
          a->code_buffer = uVar5 >> ((byte)iVar24 & 0x1f);
          a->num_bits = iVar12 - iVar24;
          iVar6 = iVar6 + (~(-1 << ((byte)iVar24 & 0x1f)) & uVar5);
        }
        if ((long)pcVar19 - (long)a->zout_start < (long)iVar6) {
          pcVar19 = "bad dist";
          goto LAB_0010b046;
        }
        if (a->zout_end < pcVar19 + (int)uVar10) {
          iVar12 = stbi__zexpand(a,pcVar19,uVar10);
          if (iVar12 == 0) {
            return 0;
          }
          pcVar19 = a->zout;
        }
        lVar8 = -(long)iVar6;
        if (iVar6 == 1) {
          if (uVar10 != 0) {
            memset(pcVar19,(uint)(byte)pcVar19[lVar8],(ulong)uVar10);
            pcVar19 = pcVar19 + (ulong)(uVar10 - 1) + 1;
          }
        }
        else {
          for (; uVar10 != 0; uVar10 = uVar10 - 1) {
            *pcVar19 = pcVar19[lVar8];
            pcVar19 = pcVar19 + 1;
          }
        }
        goto LAB_0010a8a4;
      }
    }
LAB_0010b036:
    pcVar19 = "bad huffman code";
    goto LAB_0010b046;
  }
  pbVar15 = a->zbuffer;
  pbVar2 = a->zbuffer_end;
  uVar9 = 0;
  if (pbVar15 < pbVar2) {
    a->zbuffer = pbVar15 + 1;
    bVar4 = *pbVar15;
    pbVar15 = pbVar15 + 1;
  }
  else {
    bVar4 = 0;
  }
  pbVar16 = pbVar15;
  if (pbVar15 < pbVar2) {
    pbVar16 = pbVar15 + 1;
    a->zbuffer = pbVar16;
    uVar9 = (ushort)*pbVar15;
  }
  pcVar19 = "bad zlib header";
  if ((pbVar16 < pbVar2) && ((ushort)(((ushort)bVar4 << 8 | uVar9) * 0x7bdf) < 0x843)) {
    if ((uVar9 & 0x20) == 0) {
      if ((bVar4 & 0xf) == 8) goto LAB_0010a757;
      pcVar19 = "bad compression";
    }
    else {
      pcVar19 = "no preset dict";
    }
  }
  *(char **)(in_FS_OFFSET + -0x20) = pcVar19;
LAB_0010b06c:
  return 0;
LAB_0010b030:
  a->zout = pcVar19;
LAB_0010b021:
  if ((uVar1 & 1) != 0) {
    return 1;
  }
  iVar12 = a->num_bits;
  goto LAB_0010a784;
}

Assistant:

static int stbi__do_zlib(stbi__zbuf *a, char *obuf, int olen, int exp, int parse_header)
{
   a->zout_start = obuf;
   a->zout       = obuf;
   a->zout_end   = obuf + olen;
   a->z_expandable = exp;

   return stbi__parse_zlib(a, parse_header);
}